

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int rar_br_fillup(archive_read *a,rar_br *br)

{
  ssize_t *avail;
  void *pvVar1;
  byte *pbVar2;
  ulong uVar3;
  uchar *puVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = 0x40 - br->cache_avail;
  pvVar1 = a->format->data;
  avail = &br->avail_in;
  do {
    switch(iVar5 >> 3) {
    case 0:
      return 1;
    case 6:
      if (5 < br->avail_in) {
        pbVar2 = br->next_in;
        br->cache_buffer =
             (ulong)pbVar2[5] |
             (ulong)pbVar2[4] << 8 |
             (ulong)pbVar2[3] << 0x10 |
             (ulong)pbVar2[2] << 0x18 |
             (ulong)pbVar2[1] << 0x20 | (ulong)*pbVar2 << 0x28 | br->cache_buffer << 0x30;
        br->next_in = pbVar2 + 6;
        br->avail_in = br->avail_in + -6;
        lVar6 = 6;
        lVar7 = -6;
        iVar5 = 0x30;
LAB_0020fbfe:
        br->cache_avail = br->cache_avail + iVar5;
        *(long *)((long)pvVar1 + 0x98) = *(long *)((long)pvVar1 + 0x98) + lVar6;
        *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + lVar7;
        return 1;
      }
      break;
    case 7:
      if (6 < br->avail_in) {
        pbVar2 = br->next_in;
        br->cache_buffer =
             (ulong)pbVar2[6] |
             (ulong)pbVar2[5] << 8 |
             (ulong)pbVar2[4] << 0x10 |
             (ulong)pbVar2[3] << 0x18 |
             (ulong)pbVar2[2] << 0x20 |
             (ulong)pbVar2[1] << 0x28 | (ulong)*pbVar2 << 0x30 | br->cache_buffer << 0x38;
        br->next_in = pbVar2 + 7;
        br->avail_in = br->avail_in + -7;
        lVar6 = 7;
        lVar7 = -7;
        iVar5 = 0x38;
        goto LAB_0020fbfe;
      }
      break;
    case 8:
      if (7 < br->avail_in) {
        uVar3 = *(ulong *)br->next_in;
        br->cache_buffer =
             uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
             (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
             (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
        br->next_in = (uchar *)((long)br->next_in + 8);
        br->avail_in = br->avail_in + -8;
        lVar6 = 8;
        lVar7 = -8;
        iVar5 = 0x40;
        goto LAB_0020fbfe;
      }
    }
    if (*avail < 1) {
      if (0 < *(long *)((long)pvVar1 + 0x98)) {
        __archive_read_consume(a,*(long *)((long)pvVar1 + 0x98));
        *(undefined8 *)((long)pvVar1 + 0x98) = 0;
      }
      puVar4 = (uchar *)rar_read_ahead(a,1,avail);
      br->next_in = puVar4;
      if (puVar4 == (uchar *)0x0) {
        return 0;
      }
      if (*avail == 0) {
        return 0;
      }
    }
    pbVar2 = br->next_in;
    br->next_in = pbVar2 + 1;
    br->cache_buffer = (ulong)*pbVar2 | br->cache_buffer << 8;
    br->avail_in = br->avail_in + -1;
    br->cache_avail = br->cache_avail + 8;
    iVar5 = iVar5 + -8;
    *(long *)((long)pvVar1 + 0x98) = *(long *)((long)pvVar1 + 0x98) + 1;
    *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + -1;
  } while( true );
}

Assistant:

static int
rar_br_fillup(struct archive_read *a, struct rar_br *br)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int n = CACHE_BITS - br->cache_avail;

  for (;;) {
    switch (n >> 3) {
    case 8:
      if (br->avail_in >= 8) {
        br->cache_buffer =
            ((uint64_t)br->next_in[0]) << 56 |
            ((uint64_t)br->next_in[1]) << 48 |
            ((uint64_t)br->next_in[2]) << 40 |
            ((uint64_t)br->next_in[3]) << 32 |
            ((uint32_t)br->next_in[4]) << 24 |
            ((uint32_t)br->next_in[5]) << 16 |
            ((uint32_t)br->next_in[6]) << 8 |
             (uint32_t)br->next_in[7];
        br->next_in += 8;
        br->avail_in -= 8;
        br->cache_avail += 8 * 8;
        rar->bytes_unconsumed += 8;
        rar->bytes_remaining -= 8;
        return (1);
      }
      break;
    case 7:
      if (br->avail_in >= 7) {
        br->cache_buffer =
           (br->cache_buffer << 56) |
            ((uint64_t)br->next_in[0]) << 48 |
            ((uint64_t)br->next_in[1]) << 40 |
            ((uint64_t)br->next_in[2]) << 32 |
            ((uint32_t)br->next_in[3]) << 24 |
            ((uint32_t)br->next_in[4]) << 16 |
            ((uint32_t)br->next_in[5]) << 8 |
             (uint32_t)br->next_in[6];
        br->next_in += 7;
        br->avail_in -= 7;
        br->cache_avail += 7 * 8;
        rar->bytes_unconsumed += 7;
        rar->bytes_remaining -= 7;
        return (1);
      }
      break;
    case 6:
      if (br->avail_in >= 6) {
        br->cache_buffer =
           (br->cache_buffer << 48) |
            ((uint64_t)br->next_in[0]) << 40 |
            ((uint64_t)br->next_in[1]) << 32 |
            ((uint32_t)br->next_in[2]) << 24 |
            ((uint32_t)br->next_in[3]) << 16 |
            ((uint32_t)br->next_in[4]) << 8 |
             (uint32_t)br->next_in[5];
        br->next_in += 6;
        br->avail_in -= 6;
        br->cache_avail += 6 * 8;
        rar->bytes_unconsumed += 6;
        rar->bytes_remaining -= 6;
        return (1);
      }
      break;
    case 0:
      /* We have enough compressed data in
       * the cache buffer.*/
      return (1);
    default:
      break;
    }
    if (br->avail_in <= 0) {

      if (rar->bytes_unconsumed > 0) {
        /* Consume as much as the decompressor
         * actually used. */
        __archive_read_consume(a, rar->bytes_unconsumed);
        rar->bytes_unconsumed = 0;
      }
      br->next_in = rar_read_ahead(a, 1, &(br->avail_in));
      if (br->next_in == NULL)
        return (0);
      if (br->avail_in == 0)
        return (0);
    }
    br->cache_buffer =
       (br->cache_buffer << 8) | *br->next_in++;
    br->avail_in--;
    br->cache_avail += 8;
    n -= 8;
    rar->bytes_unconsumed++;
    rar->bytes_remaining--;
  }
}